

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O0

VariableData * FindGlobalAt(ExpressionContext *exprCtx,uint offset)

{
  VariableData *pVVar1;
  bool bVar2;
  uint uVar3;
  VariableData **ppVVar4;
  uint local_3c;
  uint variableModuleIndex;
  VariableData *variable;
  uint i;
  uint targetModuleIndex;
  uint offset_local;
  ExpressionContext *exprCtx_local;
  
  i = offset;
  if (offset >> 0x18 != 0) {
    i = offset & 0xffffff;
  }
  variable._4_4_ = 0;
  do {
    uVar3 = SmallArray<VariableData_*,_128U>::size(&exprCtx->variables);
    if (uVar3 <= variable._4_4_) {
      return (VariableData *)0x0;
    }
    ppVVar4 = SmallArray<VariableData_*,_128U>::operator[](&exprCtx->variables,variable._4_4_);
    pVVar1 = *ppVVar4;
    if (pVVar1->importModule == (ModuleData *)0x0) {
      local_3c = 0;
    }
    else {
      local_3c = pVVar1->importModule->importIndex;
    }
    bVar2 = IsGlobalScope(pVVar1->scope);
    if (((bVar2) && (local_3c == offset >> 0x18)) && (pVVar1->offset <= i)) {
      if ((long)(ulong)i < (long)((ulong)pVVar1->offset + pVVar1->type->size)) {
        return pVVar1;
      }
      if (pVVar1->type->size == 0) {
        return pVVar1;
      }
    }
    variable._4_4_ = variable._4_4_ + 1;
  } while( true );
}

Assistant:

VariableData* FindGlobalAt(ExpressionContext &exprCtx, unsigned offset)
{
	unsigned targetModuleIndex = offset >> 24;

	if(targetModuleIndex)
		offset = offset & 0xffffff;

	for(unsigned i = 0; i < exprCtx.variables.size(); i++)
	{
		VariableData *variable = exprCtx.variables[i];

		unsigned variableModuleIndex = variable->importModule ? variable->importModule->importIndex : 0;

		if(IsGlobalScope(variable->scope) && variableModuleIndex == targetModuleIndex && offset >= variable->offset && (offset < variable->offset + variable->type->size || variable->type->size == 0))
			return variable;
	}

	return NULL;
}